

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ships.cpp
# Opt level: O3

void val_Orientation(Board *board,int row,int col,Ship *ship)

{
  verify_vertical_down(board,row,col,ship);
  if (ship->orientation == 'N') {
    verify_vertical_up(board,row,col,ship);
    if (ship->orientation == 'N') {
      verify_horizontal_right(board,row,col,ship);
      if (ship->orientation == 'N') {
        verify_horizontal_left(board,row,col,ship);
        if (ship->orientation == 'N') {
          ship->sRow = row;
          ship->sCol = col;
          ship->orientation = 'D';
          ship->direction = 0;
        }
      }
    }
  }
  return;
}

Assistant:

void val_Orientation( Board *board, int row, int col, Ship *ship )
{
    verify_vertical_down( board, row, col, ship );

    if( ship->orientation == 'N' )
    {
        verify_vertical_up( board, row, col, ship );
    }

    if( ship->orientation == 'N' )
    {
        verify_horizontal_right( board, row, col, ship );
    }

    if( ship->orientation == 'N' )
    {
        verify_horizontal_left( board, row, col, ship );
    }

    if( ship->orientation == 'N' )
    {
		//! if there's no valid position, then the position is denied
        ship->set_values( row, col, 'D', 0 ); 
	}
}